

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pda.cpp
# Opt level: O0

void __thiscall
Pda::addFunct(Pda *this,Node *from,Node *to,char oldStack,string *newStack,char input)

{
  Transition *this_00;
  Transition *local_40;
  Transition *t;
  string *psStack_30;
  char input_local;
  string *newStack_local;
  Node *pNStack_20;
  char oldStack_local;
  Node *to_local;
  Node *from_local;
  Pda *this_local;
  
  t._7_1_ = input;
  psStack_30 = newStack;
  newStack_local._7_1_ = oldStack;
  pNStack_20 = to;
  to_local = from;
  from_local = (Node *)this;
  this_00 = (Transition *)operator_new(0x40);
  Tjen::Node::Transition::Transition
            (this_00,to_local,pNStack_20,(char *)((long)&newStack_local + 7),newStack,t._7_1_);
  local_40 = this_00;
  std::vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>::push_back
            (&this->alltransitions,&local_40);
  Tjen::Node::addFunct(to_local,local_40);
  return;
}

Assistant:

void Pda::addFunct(Tjen::Node *from, Tjen::Node *to, char oldStack, std::string newStack, const char input) {
    Tjen::Node::Transition* t = new Tjen::Node::Transition(from,to,oldStack,newStack,input);
    this->alltransitions.push_back(t);
    from->addFunct(t);
}